

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOV.c
# Opt level: O3

bov_text_t * bov_text_new(GLubyte *string,GLenum usage)

{
  double dVar1;
  GLsizei GVar2;
  bov_text_t *pbVar3;
  size_t sVar4;
  GLfloat *data;
  long lVar5;
  bov_window_t *window;
  int len;
  
  window = (bov_window_t *)0x60;
  pbVar3 = (bov_text_t *)malloc(0x60);
  if (pbVar3 != (bov_text_t *)0x0) {
    (pbVar3->param).fillColor[0] = 0.0;
    (pbVar3->param).fillColor[1] = 0.0;
    (pbVar3->param).fillColor[2] = 0.0;
    (pbVar3->param).fillColor[3] = 1.0;
    (pbVar3->param).outlineColor[0] = 1.0;
    (pbVar3->param).outlineColor[1] = 1.0;
    (pbVar3->param).outlineColor[2] = 1.0;
    (pbVar3->param).outlineColor[3] = 2.0;
    (pbVar3->param).pos[0] = 0.0;
    (pbVar3->param).pos[1] = 0.0;
    (pbVar3->param).shift[0] = 0.0;
    (pbVar3->param).shift[1] = 0.0;
    (pbVar3->param).fontSize = 0.05;
    (pbVar3->param).boldness = 0.0;
    (pbVar3->param).outlineWidth = -1.0;
    (pbVar3->param).spaceType = USUAL_SPACE;
    (*glad_glGenVertexArrays)(1,(GLuint *)pbVar3);
    (*glad_glBindVertexArray)(pbVar3->vao);
    (*glad_glGenBuffers)(1,&pbVar3->vbo);
    (*glad_glBindBuffer)(0x8892,pbVar3->vbo);
    GVar2 = 0;
    (*glad_glVertexAttribPointer)(0,2,0x1406,'\0',0x10,(void *)0x0);
    (*glad_glVertexAttribPointer)(1,2,0x1406,'\0',0x10,(void *)0x8);
    (*glad_glEnableVertexAttribArray)(0);
    (*glad_glEnableVertexAttribArray)(1);
    if (string == (GLubyte *)0x0) {
      pbVar3->vboCapacity = 0;
      pbVar3->vboLen = 0;
      pbVar3->data = (GLfloat *)0x0;
      lVar5 = 0x10;
    }
    else {
      sVar4 = strlen((char *)string);
      len = (int)sVar4;
      pbVar3->dataCapacity = len;
      window = (bov_window_t *)((long)len * 0x60);
      data = (GLfloat *)malloc((size_t)window);
      pbVar3->data = data;
      if (data == (GLfloat *)0x0) goto LAB_0010746e;
      GVar2 = fill_text_data(data,string,len);
      pbVar3->vboLen = GVar2;
      (*glad_glBufferData)(0x8892,(long)GVar2 * 0x60,data,usage);
      GVar2 = pbVar3->vboLen;
      lVar5 = 8;
    }
    *(GLsizei *)((long)(pbVar3->param).fillColor + lVar5 + -0x20) = GVar2;
    return pbVar3;
  }
  bov_text_new_cold_2();
LAB_0010746e:
  bov_text_new_cold_1();
  lVar5 = 0xa0;
  if ((window->help_needed != 0) || (lVar5 = 0xb0, window->indication_needed != 0)) {
    bov_text_draw(window,*(bov_text_t **)((long)(window->param).res + lVar5 + -0x10));
  }
  glfwSwapBuffers(window->self);
  if (window->running == 0) {
    glfwWaitEvents();
    glfwSetTime(window->wtime);
  }
  else {
    glfwPollEvents();
    dVar1 = glfwGetTime();
    window->wtime = dVar1;
  }
  (*glad_glBindBuffer)(0x8a11,window->ubo[0]);
  (*glad_glBufferSubData)(0x8a11,0,0x14,&window->param);
  (*glad_glBindBuffer)(0x8a11,0);
  (*glad_glClearColor)
            (window->backgroundColor[0],window->backgroundColor[1],window->backgroundColor[2],
             window->backgroundColor[3]);
  pbVar3 = (bov_text_t *)(*glad_glClear)(0x4000);
  return pbVar3;
}

Assistant:

bov_text_t* bov_text_new(const GLubyte* string, GLenum usage)
{
	bov_text_t* text = malloc(sizeof(bov_text_t));
	CHECK_MALLOC(text);

	text->param = (bov_text_param_t) {
		.fillColor = {0.0f, 0.0f, 0.0f, 1.0f},
		.outlineColor = {1.0f ,1.0f, 1.0f, 2.0f},
		.pos = {0.0f, 0.0f},
		.shift = {0.0f, 0.0f},
		.fontSize = 0.05f,
		.boldness = 0.0f,
		.outlineWidth = -1.0f,
		.spaceType = USUAL_SPACE};

	// Create Vertex Array Object
	glGenVertexArrays(1, &text->vao);
	glBindVertexArray(text->vao);

	// Vertex Buffer Object
	glGenBuffers(1, &text->vbo);
	glBindBuffer(GL_ARRAY_BUFFER, text->vbo);

	// specify the layout of the data
	glVertexAttribPointer(POS_LOCATION,
	                      2,
	                      GL_FLOAT,
	                      GL_FALSE,
	                      4 * sizeof(GLfloat),
	                      0);
	glVertexAttribPointer(TEX_LOCATION,
	                      2,
	                      GL_FLOAT,
	                      GL_FALSE,
	                      4 * sizeof(GLfloat),
	                      (void*)(2 * sizeof(GLfloat)));
	glEnableVertexAttribArray(POS_LOCATION);
	glEnableVertexAttribArray(TEX_LOCATION);

	if(string!=NULL) {
		text->dataCapacity = (GLsizei) strlen((const char *)string);

		// data for text contain... 4 vertex per letter
		// for each letter, we must have
		// 2 screen coordinates      4f
		// 2 texture coordinates     4f

		text->data = malloc(sizeof(GLfloat) * 24 * text->dataCapacity);
		CHECK_MALLOC(text->data);

		// text->string = string;

		text->vboLen = fill_text_data(text->data,
		                              string,
		                              text->dataCapacity);
		glBufferData(GL_ARRAY_BUFFER,
		             sizeof(GLfloat) * 24 * text->vboLen,
		             text->data,
		             usage);
		text->vboCapacity = text->vboLen;
	}
	else {
		text->vboLen = 0;
		text->vboCapacity = 0;
		text->data = NULL;
		text->dataCapacity = 0;
	}

	// glBindBuffer(GL_ARRAY_BUFFER, 0);
	// glBindVertexArray(0);

	return text;
}